

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
ChebTools::Schur_realeigenvalues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,MatrixXd *T)

{
  Index IVar1;
  CoeffReturnType pdVar2;
  undefined4 local_20;
  int i;
  MatrixXd *T_local;
  vector<double,_std::allocator<double>_> *roots;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  local_20 = 0;
  do {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar1 <= local_20) {
      return __return_storage_ptr__;
    }
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if ((long)local_20 == IVar1 + -1) {
LAB_0010d12a:
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)T,
                          (long)local_20,(long)local_20);
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar2);
    }
    else {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)T,
                          (long)(local_20 + 1),(long)local_20);
      if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) goto LAB_0010d12a;
      local_20 = local_20 + 1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::vector<double> Schur_realeigenvalues(const Eigen::MatrixXd &T){
        std::vector<double> roots;
        for (int i = 0; i < T.cols(); ++i) {
            if (i == T.cols()-1 || T(i+1,i) == 0){
                // This is a real 1x1 block, if it were the second row in a 2x2 block it
                // would have been skipped in the next conditional
                roots.push_back(T(i, i));
            }
            else{
                // this is the upper left element of a 2x2 block,
                // keep moving, skip the next row too
                i += 1;
            }
        }
        return roots;
    }